

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzerSettings.cpp
# Opt level: O3

void __thiscall SpiAnalyzerSettings::LoadSettings(SpiAnalyzerSettings *this,char *settings)

{
  Channel *this_00;
  Channel *this_01;
  Channel *this_02;
  Channel *this_03;
  int iVar1;
  SimpleArchive text_archive;
  char *name_string;
  SimpleArchive aSStack_48 [8];
  Channel local_40 [16];
  char *local_30;
  
  SimpleArchive::SimpleArchive(aSStack_48);
  SimpleArchive::SetString((char *)aSStack_48);
  SimpleArchive::operator>>(aSStack_48,&local_30);
  iVar1 = strcmp(local_30,"SaleaeSpiAnalyzer");
  if (iVar1 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeSpiAnalyzer: Provided with a settings string that doesn\'t belong to us;");
  }
  this_00 = &this->mMosiChannel;
  SimpleArchive::operator>>(aSStack_48,this_00);
  this_01 = &this->mMisoChannel;
  SimpleArchive::operator>>(aSStack_48,this_01);
  this_02 = &this->mClockChannel;
  SimpleArchive::operator>>(aSStack_48,this_02);
  this_03 = &this->mEnableChannel;
  SimpleArchive::operator>>(aSStack_48,this_03);
  SimpleArchive::operator>>(aSStack_48,&this->mShiftOrder);
  SimpleArchive::operator>>(aSStack_48,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(aSStack_48,&this->mClockInactiveState);
  SimpleArchive::operator>>(aSStack_48,&this->mDataValidEdge);
  SimpleArchive::operator>>(aSStack_48,&this->mEnableActiveState);
  AnalyzerSettings::ClearChannels();
  Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(this_00,local_40);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  Channel::~Channel(local_40);
  Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(this_01,local_40);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
  Channel::~Channel(local_40);
  Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(this_02,local_40);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_02,true);
  Channel::~Channel(local_40);
  Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(this_03,local_40);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_03,true);
  Channel::~Channel(local_40);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(aSStack_48);
  return;
}

Assistant:

void SpiAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeSpiAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeSpiAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mMosiChannel;
    text_archive >> mMisoChannel;
    text_archive >> mClockChannel;
    text_archive >> mEnableChannel;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mBitsPerTransfer;
    text_archive >> *( U32* )&mClockInactiveState;
    text_archive >> *( U32* )&mDataValidEdge;
    text_archive >> *( U32* )&mEnableActiveState;

    // bool success = text_archive >> mUsePackets;  //new paramater added -- do this for backwards compatibility
    // if( success == false )
    //	mUsePackets = false; //if the archive fails, set the default value

    ClearChannels();
    AddChannel( mMosiChannel, "MOSI", mMosiChannel != UNDEFINED_CHANNEL );
    AddChannel( mMisoChannel, "MISO", mMisoChannel != UNDEFINED_CHANNEL );
    AddChannel( mClockChannel, "CLOCK", mClockChannel != UNDEFINED_CHANNEL );
    AddChannel( mEnableChannel, "ENABLE", mEnableChannel != UNDEFINED_CHANNEL );

    UpdateInterfacesFromSettings();
}